

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O0

bool __thiscall mp::SolCheck::HasAnyConViols(SolCheck *this)

{
  const_reference pvVar1;
  size_type sVar2;
  size_type in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar3;
  
  pvVar1 = std::array<mp::ViolSummary,_2UL>::operator[]
                     ((array<mp::ViolSummary,_2UL> *)
                      CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),in_RDI);
  bVar3 = true;
  if (pvVar1->N_ == 0) {
    pvVar1 = std::array<mp::ViolSummary,_2UL>::operator[]
                       ((array<mp::ViolSummary,_2UL> *)CONCAT17(1,in_stack_fffffffffffffff0),in_RDI)
    ;
    bVar3 = true;
    if (pvVar1->N_ == 0) {
      pvVar1 = std::array<mp::ViolSummary,_2UL>::operator[]
                         ((array<mp::ViolSummary,_2UL> *)CONCAT17(1,in_stack_fffffffffffffff0),
                          in_RDI);
      bVar3 = true;
      if (pvVar1->N_ == 0) {
        pvVar1 = std::array<mp::ViolSummary,_2UL>::operator[]
                           ((array<mp::ViolSummary,_2UL> *)CONCAT17(1,in_stack_fffffffffffffff0),
                            in_RDI);
        bVar3 = true;
        if (pvVar1->N_ == 0) {
          sVar2 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                  ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                          *)0x17275c);
          bVar3 = true;
          if (sVar2 == 0) {
            sVar2 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                    ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
                            *)0x17277b);
            bVar3 = sVar2 != 0;
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool HasAnyConViols() const {
    return viol_var_bnds_[0].N_ || viol_var_bnds_[1].N_
           || viol_var_int_[0].N_ || viol_var_int_[1].N_
           || viol_cons_alg_.size()
           || viol_cons_log_.size();
  }